

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

_Bool option_toggle_handle(menu *m,ui_event *event,wchar_t oid)

{
  uint uVar1;
  _Bool _Var2;
  int page;
  char *pcVar3;
  char *command;
  int val;
  char dummy;
  char dummy_1;
  char local_22;
  char local_21;
  
  page = option_type(oid);
  if (event->type != EVT_KBRD) {
    if (event->type != EVT_SELECT) {
      return false;
    }
    if ((page == 1) && (m->flags == 2)) {
      return true;
    }
switchD_001e1680_caseD_54:
    pcVar3 = option_name(oid);
    option_set(pcVar3,(player->opts).opt[oid] ^ 1);
    goto LAB_001e16f4;
  }
  uVar1 = (event->key).code;
  val = 1;
  _Var2 = false;
  switch(uVar1) {
  case 0x4e:
switchD_001e1680_caseD_4e:
    val = 0;
  case 0x59:
switchD_001e1680_caseD_59:
    pcVar3 = option_name(oid);
    option_set(pcVar3,val);
    m->cursor = (m->cursor + m->filter_count + 1) % m->filter_count;
    break;
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x57:
    goto switchD_001e1680_caseD_4f;
  case 0x52:
switchD_001e1680_caseD_52:
    if ((page == 1) && (m->flags != 0x10)) {
      if ((uVar1 | 0x20) != 0x78) {
        return false;
      }
      goto switchD_001e1680_caseD_58;
    }
    screen_save();
    _Var2 = options_restore_custom(&player->opts,page);
    if (!_Var2) {
      pcVar3 = "Restore failed.  Press any key to continue.";
      command = &local_22;
      goto LAB_001e176e;
    }
    screen_load();
    goto LAB_001e17a6;
  case 0x53:
switchD_001e1680_caseD_53:
    screen_save();
    _Var2 = options_save_custom(&player->opts,page);
    pcVar3 = "Save failed.  Press any key to continue.";
    if (_Var2) {
      pcVar3 = "Successfully saved.  Press any key to continue.";
    }
    command = &local_21;
LAB_001e176e:
    get_com(pcVar3,command);
    screen_load();
    break;
  case 0x54:
    goto switchD_001e1680_caseD_54;
  case 0x58:
switchD_001e1680_caseD_58:
    if ((page == 1) && (m->flags != 0x10)) {
      return false;
    }
    options_restore_maintainer(&player->opts,page);
LAB_001e17a6:
    menu_refresh(m,false);
    break;
  default:
    switch(uVar1) {
    case 0x6e:
      goto switchD_001e1680_caseD_4e;
    default:
      goto switchD_001e1680_caseD_4f;
    case 0x72:
      goto switchD_001e1680_caseD_52;
    case 0x73:
      goto switchD_001e1680_caseD_53;
    case 0x74:
      goto switchD_001e1680_caseD_54;
    case 0x78:
      goto switchD_001e1680_caseD_58;
    case 0x79:
      goto switchD_001e1680_caseD_59;
    }
  }
LAB_001e16f4:
  _Var2 = true;
switchD_001e1680_caseD_4f:
  return _Var2;
}

Assistant:

static bool option_toggle_handle(struct menu *m, const ui_event *event,
		int oid)
{
	bool next = false;
	int page = option_type(oid);

	if (event->type == EVT_SELECT) {
		/* Hack -- birth options can not be toggled after birth */
		/* At birth, m->flags == MN_DBL_TAP. */
		/* After birth, m->flags == MN_NO_TAGS */
		if (!((page == OP_BIRTH) && (m->flags == MN_NO_TAGS))) {
			option_set(option_name(oid), !player->opts.opt[oid]);
		}
	} else if (event->type == EVT_KBRD) {
		if (event->key.code == 'y' || event->key.code == 'Y') {
			option_set(option_name(oid), true);
			next = true;
		} else if (event->key.code == 'n' || event->key.code == 'N') {
			option_set(option_name(oid), false);
			next = true;
		} else if (event->key.code == 't' || event->key.code == 'T') {
			option_set(option_name(oid), !player->opts.opt[oid]);
		} else if (event->key.code == 's' || event->key.code == 'S') {
			char dummy;

			screen_save();
			if (options_save_custom(&player->opts, page)) {
				get_com("Successfully saved.  Press any key to continue.", &dummy);
			} else {
				get_com("Save failed.  Press any key to continue.", &dummy);
			}
			screen_load();
		/*
		 * For birth options, only allow restore from custom defaults
		 * at birth.
		 */
		} else if ((event->key.code == 'r' || event->key.code == 'R') &&
				(page != OP_BIRTH || m->flags == MN_DBL_TAP)) {
			screen_save();
			if (options_restore_custom(&player->opts, page)) {
				screen_load();
				menu_refresh(m, false);
			} else {
				char dummy;

				get_com("Restore failed.  Press any key to continue.", &dummy);
				screen_load();
			}
		/*
		 * For birth options, only allow restore to the maintainer's
		 * defaults at birth.
		 */
		} else if ((event->key.code == 'x' || event->key.code == 'X') &&
				(page != OP_BIRTH || m->flags == MN_DBL_TAP)) {
			options_restore_maintainer(&player->opts, page);
			menu_refresh(m, false);
		} else {
			return false;
		}
	} else {
		return false;
	}

	if (next) {
		m->cursor++;
		m->cursor = (m->cursor + m->filter_count) % m->filter_count;
	}

	return true;
}